

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handles.cpp
# Opt level: O2

void __thiscall uv11::Handle::~Handle(Handle *this)

{
  this->_vptr_Handle = (_func_int **)&PTR__Handle_0010da10;
  std::_Function_base::~_Function_base(&(this->on_close).super__Function_base);
  std::_Function_base::~_Function_base(&(this->on_alloc).super__Function_base);
  return;
}

Assistant:

Handle::~Handle() {}